

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

unsigned_short * crnd::crnd_new_array<unsigned_short>(uint32 num)

{
  uint *puVar1;
  uint in_EDI;
  unsigned_short *p;
  uint8 *q;
  size_t *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  uint local_c;
  uint *local_8;
  
  local_c = in_EDI;
  if (in_EDI == 0) {
    local_c = 1;
  }
  puVar1 = (uint *)crnd_malloc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (puVar1 == (uint *)0x0) {
    local_8 = (uint *)0x0;
  }
  else {
    local_8 = puVar1 + 2;
    puVar1[1] = local_c;
    *puVar1 = local_c ^ 0xffffffff;
    helpers::construct_array<unsigned_short>((unsigned_short *)local_8,local_c);
  }
  return (unsigned_short *)local_8;
}

Assistant:

inline T* crnd_new_array(uint32 num) {
  if (!num)
    num = 1;

  uint8* q = static_cast<uint8*>(crnd_malloc(CRND_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
  if (!q)
    return NULL;

  T* p = reinterpret_cast<T*>(q + CRND_MIN_ALLOC_ALIGNMENT);

  reinterpret_cast<uint32*>(p)[-1] = num;
  reinterpret_cast<uint32*>(p)[-2] = ~num;

  helpers::construct_array(p, num);
  return p;
}